

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String __thiscall Bstrlib::String::fromTo(String *this,String *from,String *to,bool includeFind)

{
  int len;
  int iVar1;
  undefined7 in_register_00000009;
  uchar *extraout_RDX;
  char in_R8B;
  String SVar3;
  uchar *puVar2;
  
  iVar1 = binstr(&from->super_tagbstring,0,&to->super_tagbstring);
  if (iVar1 == -1) {
    String(this,"");
    puVar2 = extraout_RDX;
  }
  else {
    binstr(&from->super_tagbstring,(to->super_tagbstring).slen + iVar1,
           (bstring)CONCAT71(in_register_00000009,includeFind));
    len = (to->super_tagbstring).slen + iVar1;
    if (in_R8B != '\0') {
      len = iVar1;
    }
    SVar3 = midString(this,(int)from,len);
    puVar2 = SVar3.super_tagbstring.data;
  }
  SVar3.super_tagbstring.data = puVar2;
  SVar3.super_tagbstring._0_8_ = this;
  return (String)SVar3.super_tagbstring;
}

Assistant:

const String String::fromTo(const String & from, const String & to, const bool includeFind) const
    {
        const int fromPos = Find(from);
        if (fromPos == -1) return "";
        const int toPos = Find(to, fromPos + from.slen);
        return midString(includeFind ? fromPos : fromPos + from.slen, toPos != -1 ? (includeFind ? toPos + to.slen - fromPos : toPos - fromPos - from.slen)
                                           // If the "to" needle was not found, either we return the whole string (includeFind) or an empty string
                                           : (includeFind ? slen - fromPos : 0));
    }